

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O3

void __thiscall spvtools::opt::LoopUtils::CreateLoopDedicatedExits(LoopUtils *this)

{
  DefUseManager *pDVar1;
  pointer puVar2;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> blk;
  uint32_t *puVar3;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var4;
  CFG *this_00;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar5;
  Instruction *pIVar6;
  char cVar7;
  Analysis AVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  const_iterator cVar11;
  BasicBlock *pBVar12;
  mapped_type *ppBVar13;
  iterator instr;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false> _Var14;
  __node_type *extraout_RAX;
  Instruction *pIVar15;
  long lVar16;
  IRContext *pIVar17;
  long lVar18;
  pointer puVar19;
  uint32_t *puVar20;
  IRContext *this_01;
  Instruction *pIVar21;
  const_iterator __position;
  __node_base _Var22;
  string message;
  BasicBlock *non_dedicate;
  InstructionBuilder builder;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  new_loop_exits;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_bb_set;
  _Any_data local_168;
  IRContext *local_158;
  code *local_150;
  Instruction *local_140;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_138;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
  *local_130;
  CFG *local_128;
  _Hash_node_base *local_120;
  Function *local_118;
  BasicBlock *local_110;
  InstructionBuilder local_108;
  LoopDescriptor *local_e8;
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  local_e0;
  undefined8 local_d8;
  code *local_d0;
  code *local_c8;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_c0;
  DefUseManager *local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_b0;
  Instruction *local_a8;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_118 = this->loop_->loop_header_->function_;
  local_e8 = IRContext::GetLoopDescriptor(this->context_,local_118);
  pIVar17 = this->context_;
  AVar8 = pIVar17->valid_analyses_;
  this_01 = pIVar17;
  if ((AVar8 & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar17);
    this_01 = this->context_;
    AVar8 = this_01->valid_analyses_;
  }
  local_128 = (pIVar17->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  if ((AVar8 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_01);
  }
  pDVar1 = (this_01->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  Loop::GetExitBlocks(this->loop_,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&local_68);
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    local_c0 = &local_118->blocks_;
    local_e8 = (LoopDescriptor *)&local_e8->basic_block_to_loop_;
    local_130 = (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                 *)0x0;
    _Var22._M_nxt = local_68._M_before_begin._M_nxt;
    local_b8 = pDVar1;
    do {
      this_00 = local_128;
      uVar9 = *(uint32_t *)&_Var22._M_nxt[1]._M_nxt;
      local_138._M_head_impl = CFG::block(local_128,uVar9);
      local_b0 = CFG::preds(this_00,uVar9);
      pIVar15 = (Instruction *)
                (local_b0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pIVar21 = (Instruction *)
                (local_b0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar16 = (long)pIVar21 - (long)pIVar15;
      if (0 < lVar16 >> 4) {
        lVar18 = (lVar16 >> 4) + 1;
        pIVar6 = (Instruction *)
                 &(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        local_140 = pIVar21;
        do {
          pIVar15 = pIVar6;
          local_168._0_4_ = pIVar15[-1].dbg_scope_.lexical_scope_;
          cVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data)
          ;
          if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            pIVar15 = (Instruction *)&pIVar15[-1].dbg_scope_;
            pIVar21 = local_140;
            goto LAB_005e67fa;
          }
          local_168._0_4_ = pIVar15[-1].dbg_scope_.inlined_at_;
          cVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data)
          ;
          if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            pIVar15 = (Instruction *)&pIVar15[-1].dbg_scope_.inlined_at_;
            pIVar21 = local_140;
            goto LAB_005e67fa;
          }
          local_168._0_4_ =
               *(uint *)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase;
          cVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data)
          ;
          pIVar21 = local_140;
          if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
          goto LAB_005e67fa;
          local_168._0_4_ =
               *(pointer)((long)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                 _vptr_IntrusiveNodeBase + 4);
          cVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data)
          ;
          pIVar21 = local_140;
          if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            pIVar15 = (Instruction *)
                      ((long)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                              _vptr_IntrusiveNodeBase + 4);
            goto LAB_005e67fa;
          }
          lVar18 = lVar18 + -1;
          lVar16 = lVar16 + -0x10;
          pIVar6 = (Instruction *)
                   &(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        } while (1 < lVar18);
        pIVar15 = (Instruction *)
                  &(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      }
      lVar16 = lVar16 >> 2;
      if (lVar16 == 1) {
LAB_005e67c5:
        local_168._0_4_ =
             *(uint *)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                       _vptr_IntrusiveNodeBase;
        cVar11 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data);
        if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
          pIVar15 = pIVar21;
        }
LAB_005e67fa:
        if (pIVar15 == pIVar21) goto LAB_005e6d10;
        __position._M_current =
             (local_118->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        puVar19 = __position._M_current;
        while( true ) {
          if (__position._M_current ==
              (local_118->blocks_).
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("insert_pt != function->end() && \"Basic Block not found\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                          ,0x15f,"void spvtools::opt::LoopUtils::CreateLoopDedicatedExits()");
          }
          if (((__position._M_current)->_M_t).
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
              local_138._M_head_impl) break;
          __position._M_current = __position._M_current + 1;
          puVar19 = puVar19 + 1;
        }
        pBVar12 = (BasicBlock *)operator_new(0x88);
        local_140 = (Instruction *)operator_new(0x70);
        pIVar17 = this->context_;
        uVar9 = Module::TakeNextIdBound
                          ((pIVar17->module_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((uVar9 == 0) &&
           ((pIVar17->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
          local_120 = (_Hash_node_base *)((ulong)local_120 & 0xffffffff00000000);
          local_130 = &pIVar17->consumer_;
          local_168._M_unused._M_object = &local_158;
          local_108.context_ = (IRContext *)0x25;
          local_168._M_unused._0_8_ =
               (undefined8)
               std::__cxx11::string::_M_create((ulong *)local_168._M_pod_data,(ulong)&local_108);
          local_158 = local_108.context_;
          *(undefined8 *)local_168._M_unused._0_8_ = 0x667265766f204449;
          *(undefined8 *)((long)local_168._M_unused._0_8_ + 8) = 0x797254202e776f6c;
          *(undefined8 *)((long)local_168._M_unused._0_8_ + 0x10) = 0x676e696e6e757220;
          *(undefined8 *)((long)local_168._M_unused._0_8_ + 0x18) = 0x746361706d6f6320;
          builtin_strncpy((char *)((long)local_168._M_unused._0_8_ + 0x1d),"act-ids.",8);
          local_168._8_8_ = local_108.context_;
          *(char *)((long)&(local_108.context_)->syntax_context_ + (long)local_168._M_unused._0_8_)
               = '\0';
          local_108.context_ = (IRContext *)0x0;
          local_108.parent_ = (BasicBlock *)0x0;
          local_108.insert_before_.super_iterator.node_ = (iterator)(Instruction *)0x0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(local_130,SPV_MSG_ERROR,"",(spv_position_t *)&local_108,
                     (char *)local_168._M_unused._0_8_);
          if ((IRContext **)local_168._M_unused._0_8_ != &local_158) {
            operator_delete(local_168._M_unused._M_object,
                            (ulong)((long)&local_158->syntax_context_ + 1));
          }
          uVar9 = (uint32_t)local_120;
        }
        pIVar15 = local_140;
        local_168._M_unused._M_object = (BasicBlock *)0x0;
        local_168._8_8_ = (BasicBlock *)0x0;
        local_158 = (IRContext *)0x0;
        local_120 = _Var22._M_nxt;
        Instruction::Instruction(local_140,pIVar17,OpLabel,0,uVar9,(OperandList *)&local_168);
        pvVar5 = local_c0;
        pBVar12->function_ = (Function *)0x0;
        (pBVar12->label_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar15;
        pIVar15 = &(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
             (_func_int **)&PTR__Instruction_009309d8;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
             (IRContext *)0x0;
        *(undefined8 *)
         ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 context_ + 6) = 0;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 dbg_line_insts_.
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 dbg_line_insts_.
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        lexical_scope_ = 0;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
        inlined_at_ = 0;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar15;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar15;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
        super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
        (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
             (_func_int **)&PTR__InstructionList_00930a70;
        puVar2 = (local_c0->
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_110 = pBVar12;
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::_M_insert_rval(local_c0,__position,(value_type *)&local_110);
        blk._M_head_impl =
             *(Instruction **)
              (((long)(pvVar5->
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start - (long)puVar2) + (long)puVar19);
        if (local_110 != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)&local_110,local_110);
        }
        local_110 = (BasicBlock *)0x0;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_168);
        ((blk._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase = (_func_int **)local_118;
        puVar3 = (local_b0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
        for (puVar20 = (local_b0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start; pDVar1 = local_b8,
            puVar20 != puVar3; puVar20 = puVar20 + 1) {
          uVar9 = *puVar20;
          local_168._0_4_ = uVar9;
          cVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data)
          ;
          if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            pBVar12 = CFG::block(local_128,uVar9);
            local_168._M_unused._M_function_pointer = (_func_void *)local_138._M_head_impl;
            local_150 = std::
                        _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:364:43)>
                        ::_M_invoke;
            local_158 = (IRContext *)
                        std::
                        _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:364:43)>
                        ::_M_manager;
            local_168._8_8_ = blk._M_head_impl;
            BasicBlock::ForEachSuccessorLabel(pBVar12,(function<void_(unsigned_int_*)> *)&local_168)
            ;
            if (local_158 != (IRContext *)0x0) {
              (*(code *)local_158)(&local_168,&local_168,3);
            }
            CFG::RegisterBlock(local_128,pBVar12);
          }
        }
        analysis::DefUseManager::AnalyzeInstDefUse
                  (local_b8,(Instruction *)
                            (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               *)&((blk._M_head_impl)->
                                  super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_)->
                            _M_t).
                            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>);
        pIVar17 = this->context_;
        local_168._M_unused._0_8_ =
             (undefined8)
             (((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&((blk._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                   next_node_)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>;
        if ((pIVar17->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
          ppBVar13 = std::__detail::
                     _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&pIVar17->instr_to_block_,(key_type *)&local_168);
          *ppBVar13 = (mapped_type)blk._M_head_impl;
          pIVar17 = this->context_;
        }
        local_108.insert_before_.super_iterator.node_ =
             (iterator)
             &((blk._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_
        ;
        local_108.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
        pIVar15 = ((local_138._M_head_impl)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        local_108.context_ = pIVar17;
        local_108.parent_ = (BasicBlock *)blk._M_head_impl;
        if (pIVar15->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
        }
        instr.node_ = InstructionBuilder::AddBranch(&local_108,uVar9);
        local_108.parent_ = IRContext::get_instr_block(local_108.context_,instr.node_);
        _Var4._M_head_impl = local_138._M_head_impl;
        local_d8 = 0;
        local_108.insert_before_.super_iterator.node_ = (iterator)(iterator)instr.node_;
        local_e0.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)operator_new(0x20);
        (((Instruction *)
         local_e0.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl)->
        super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
             (_func_int **)&local_108;
        (((Instruction *)
         local_e0.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl)->
        super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = blk._M_head_impl;
        (((Instruction *)
         local_e0.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl)->
        super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)pDVar1;
        *(LoopUtils **)
         &(((Instruction *)
           local_e0.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl)->
          super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = this;
        local_c8 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:384:9)>
                   ::_M_invoke;
        local_d0 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:384:9)>
                   ::_M_manager;
        local_168._8_8_ = 0;
        local_168._M_unused._M_object = &local_e0;
        local_150 = std::
                    _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                    ::_M_invoke;
        local_158 = (IRContext *)
                    std::
                    _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                    ::_M_manager;
        pIVar15 = ((_Var4._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                  sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar15 == (Instruction *)0x0) ||
           ((pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_005e6c37:
          (*(code *)local_158)(&local_168,&local_168,3);
        }
        else {
          do {
            if (pIVar15 == (Instruction *)0x0) break;
            pIVar21 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
            if ((pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false
               ) {
              pIVar21 = (Instruction *)0x0;
            }
            if (pIVar15->opcode_ != OpPhi) break;
            local_a8 = pIVar15;
            if (local_158 == (IRContext *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar7 = (*local_150)(&local_168,(uint **)&local_a8);
            pIVar15 = pIVar21;
          } while (cVar7 != '\0');
          if (local_158 != (IRContext *)0x0) goto LAB_005e6c37;
        }
        if (local_d0 != (code *)0x0) {
          (*local_d0)(&local_e0,&local_e0,3);
        }
        CFG::RegisterBlock(local_128,(BasicBlock *)blk._M_head_impl);
        _Var22._M_nxt = local_120;
        pIVar15 = ((local_138._M_head_impl)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar10 = 0;
        uVar9 = 0;
        if (pIVar15->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
        }
        CFG::RemoveNonExistingEdges(local_128,uVar9);
        local_168._M_unused._M_object = &local_a0;
        local_e0.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)
             (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)blk._M_head_impl;
        std::
        _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::BasicBlock*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                  ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_168._M_unused._0_8_,&local_e0,&local_168);
        pIVar15 = ((local_138._M_head_impl)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if (pIVar15->has_result_id_ == true) {
          uVar10 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
        }
        local_168._0_4_ = uVar10;
        _Var14._M_cur =
             (__node_type *)
             std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_e8,(key_type *)local_168._M_pod_data);
        if ((_Var14._M_cur != (__node_type *)0x0) &&
           (*(Loop **)((long)_Var14._M_cur + 0x10) != (Loop *)0x0)) {
          Loop::AddBasicBlock(*(Loop **)((long)_Var14._M_cur + 0x10),(BasicBlock *)blk._M_head_impl)
          ;
          _Var14._M_cur = extraout_RAX;
        }
        local_130 = (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                     *)CONCAT71((int7)((ulong)_Var14._M_cur >> 8),1);
      }
      else {
        if (lVar16 == 2) {
LAB_005e67a5:
          local_168._0_4_ =
               *(uint *)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase;
          cVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data)
          ;
          if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            pIVar15 = (Instruction *)
                      ((long)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                              _vptr_IntrusiveNodeBase + 4);
            goto LAB_005e67c5;
          }
          goto LAB_005e67fa;
        }
        if (lVar16 == 3) {
          local_168._0_4_ =
               *(uint *)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase;
          cVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(this->loop_->loop_basic_blocks_)._M_h,(key_type *)local_168._M_pod_data)
          ;
          if (cVar11.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            pIVar15 = (Instruction *)
                      ((long)&(pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                              _vptr_IntrusiveNodeBase + 4);
            goto LAB_005e67a5;
          }
          goto LAB_005e67fa;
        }
LAB_005e6d10:
        local_168._M_unused._M_object = &local_a0;
        std::
        _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                  ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_168._M_unused._0_8_,&local_138,&local_168);
      }
      _Var22._M_nxt = (_Var22._M_nxt)->_M_nxt;
    } while (_Var22._M_nxt != (_Hash_node_base *)0x0);
    if (local_a0._M_element_count == 1) {
      Loop::SetMergeBlock(this->loop_,(BasicBlock *)local_a0._M_before_begin._M_nxt[1]._M_nxt);
    }
    if (((ulong)local_130 & 1) != 0) {
      IRContext::InvalidateAnalysesExceptFor
                (this->context_,
                 kAnalysisLoopAnalysis|kAnalysisCFG|kAnalysisInstrToBlockMapping|kAnalysisBegin);
    }
  }
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void LoopUtils::CreateLoopDedicatedExits() {
  Function* function = loop_->GetHeaderBlock()->GetParent();
  LoopDescriptor& loop_desc = *context_->GetLoopDescriptor(function);
  CFG& cfg = *context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  const IRContext::Analysis PreservedAnalyses =
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping;

  // Gathers the set of basic block that are not in this loop and have at least
  // one predecessor in the loop and one not in the loop.
  std::unordered_set<uint32_t> exit_bb_set;
  loop_->GetExitBlocks(&exit_bb_set);

  std::unordered_set<BasicBlock*> new_loop_exits;
  bool made_change = false;
  // For each block, we create a new one that gathers all branches from
  // the loop and fall into the block.
  for (uint32_t non_dedicate_id : exit_bb_set) {
    BasicBlock* non_dedicate = cfg.block(non_dedicate_id);
    const std::vector<uint32_t>& bb_pred = cfg.preds(non_dedicate_id);
    // Ignore the block if all the predecessors are in the loop.
    if (std::all_of(bb_pred.begin(), bb_pred.end(),
                    [this](uint32_t id) { return loop_->IsInsideLoop(id); })) {
      new_loop_exits.insert(non_dedicate);
      continue;
    }

    made_change = true;
    Function::iterator insert_pt = function->begin();
    for (; insert_pt != function->end() && &*insert_pt != non_dedicate;
         ++insert_pt) {
    }
    assert(insert_pt != function->end() && "Basic Block not found");

    // Create the dedicate exit basic block.
    // TODO(1841): Handle id overflow.
    BasicBlock& exit = *insert_pt.InsertBefore(std::unique_ptr<BasicBlock>(
        new BasicBlock(std::unique_ptr<Instruction>(new Instruction(
            context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})))));
    exit.SetParent(function);

    // Redirect in loop predecessors to |exit| block.
    for (uint32_t exit_pred_id : bb_pred) {
      if (loop_->IsInsideLoop(exit_pred_id)) {
        BasicBlock* pred_block = cfg.block(exit_pred_id);
        pred_block->ForEachSuccessorLabel([non_dedicate, &exit](uint32_t* id) {
          if (*id == non_dedicate->id()) *id = exit.id();
        });
        // Update the CFG.
        // |non_dedicate|'s predecessor list will be updated at the end of the
        // loop.
        cfg.RegisterBlock(pred_block);
      }
    }

    // Register the label to the def/use manager, requires for the phi patching.
    def_use_mgr->AnalyzeInstDefUse(exit.GetLabelInst());
    context_->set_instr_block(exit.GetLabelInst(), &exit);

    InstructionBuilder builder(context_, &exit, PreservedAnalyses);
    // Now jump from our dedicate basic block to the old exit.
    // We also reset the insert point so all instructions are inserted before
    // the branch.
    builder.SetInsertPoint(builder.AddBranch(non_dedicate->id()));
    non_dedicate->ForEachPhiInst(
        [&builder, &exit, def_use_mgr, this](Instruction* phi) {
          // New phi operands for this instruction.
          std::vector<uint32_t> new_phi_op;
          // Phi operands for the dedicated exit block.
          std::vector<uint32_t> exit_phi_op;
          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            uint32_t def_id = phi->GetSingleWordInOperand(i);
            uint32_t incoming_id = phi->GetSingleWordInOperand(i + 1);
            if (loop_->IsInsideLoop(incoming_id)) {
              exit_phi_op.push_back(def_id);
              exit_phi_op.push_back(incoming_id);
            } else {
              new_phi_op.push_back(def_id);
              new_phi_op.push_back(incoming_id);
            }
          }

          // Build the new phi instruction dedicated exit block.
          Instruction* exit_phi = builder.AddPhi(phi->type_id(), exit_phi_op);
          // Build the new incoming branch.
          new_phi_op.push_back(exit_phi->result_id());
          new_phi_op.push_back(exit.id());
          // Rewrite operands.
          uint32_t idx = 0;
          for (; idx < new_phi_op.size(); idx++)
            phi->SetInOperand(idx, {new_phi_op[idx]});
          // Remove extra operands, from last to first (more efficient).
          for (uint32_t j = phi->NumInOperands() - 1; j >= idx; j--)
            phi->RemoveInOperand(j);
          // Update the def/use manager for this |phi|.
          def_use_mgr->AnalyzeInstUse(phi);
        });
    // Update the CFG.
    cfg.RegisterBlock(&exit);
    cfg.RemoveNonExistingEdges(non_dedicate->id());
    new_loop_exits.insert(&exit);
    // If non_dedicate is in a loop, add the new dedicated exit in that loop.
    if (Loop* parent_loop = loop_desc[non_dedicate])
      parent_loop->AddBasicBlock(&exit);
  }

  if (new_loop_exits.size() == 1) {
    loop_->SetMergeBlock(*new_loop_exits.begin());
  }

  if (made_change) {
    context_->InvalidateAnalysesExceptFor(
        PreservedAnalyses | IRContext::kAnalysisCFG |
        IRContext::Analysis::kAnalysisLoopAnalysis);
  }
}